

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O3

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::TPZCompElHCurl(TPZCompElHCurl<pzshape::TPZShapeQuad> *this)

{
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0194ae60;
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeQuad>,&PTR_PTR_019473d8);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHCurl_01947008;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0188d9a8;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 5;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  this->fhcurlfam = EHCurlStandard;
  (this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = -1;
  *(undefined4 *)(this->fConnectIndexes).fExtAlloc = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 1) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0xc) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 2) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x14) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 3) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x1c) = 0xffffffff;
  (this->fConnectIndexes).fExtAlloc[4] = -1;
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::TPZCompElHCurl() :
TPZRegisterClassId(&TPZCompElHCurl::ClassId),
TPZIntelGen<TSHAPE>()
{
	this->fPreferredOrder = -1;
	int i;
	for(i=0;i<TSHAPE::NSides-TSHAPE::NCornerNodes;i++) {
		this-> fConnectIndexes[i] = -1;
	}

}